

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<std::basic_string_view<char,std::char_traits<char>>const&>::operator>
          (result *__return_storage_ptr__,
          expression_lhs<std::basic_string_view<char,std::char_traits<char>>const&> *this,
          char (*rhs) [6])

{
  lest *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  size_t sVar2;
  char (*in_R8) [6];
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  allocator<char> local_71;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50 [2];
  
  __x = **(basic_string_view<char,_std::char_traits<char>_> **)this;
  sVar2 = strlen(*rhs);
  __y._M_str = *rhs;
  __y._M_len = sVar2;
  bVar1 = std::operator>(__x,__y);
  this_00 = *(lest **)this;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,">",&local_71);
  to_string<std::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_70,this_00,local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = bVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }